

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> __thiscall
jaegertracing::Tracer::startSpanInternal
          (Tracer *this,SpanContext *context,string *operationName,time_point *startTimeSystem,
          time_point *startTimeSteady,
          vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *internalTags,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
          *tags,bool newTrace,
          vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *references)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  Span *this_00;
  element_type *peVar5;
  Counter *pCVar6;
  pointer pSVar7;
  undefined4 extraout_var;
  undefined7 in_stack_00000011;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *in_stack_00000020;
  enable_shared_from_this<jaegertracing::Tracer> local_d0;
  undefined1 local_b9;
  Tag *local_b8;
  Tag *local_b0;
  __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_a8;
  __normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
  local_a0;
  const_iterator local_98;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *local_90;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>
  *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>
  *local_70;
  undefined1 local_58 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> spanTags;
  bool newTrace_local;
  time_point *startTimeSteady_local;
  time_point *startTimeSystem_local;
  string *operationName_local;
  SpanContext *context_local;
  Tracer *this_local;
  unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> *span;
  
  spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)references & 1;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_58);
  sVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
                  *)CONCAT71(in_stack_00000011,newTrace));
  sVar4 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                    ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)tags);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::reserve
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_58,
             sVar3 + sVar4);
  local_70 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>
              *)std::
                begin<std::vector<std::pair<std::__cxx11::string,opentracing::v3::Value>,std::allocator<std::pair<std::__cxx11::string,opentracing::v3::Value>>>>
                          ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
                            *)CONCAT71(in_stack_00000011,newTrace));
  local_78 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>
              *)std::
                end<std::vector<std::pair<std::__cxx11::string,opentracing::v3::Value>,std::allocator<std::pair<std::__cxx11::string,opentracing::v3::Value>>>>
                          ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
                            *)CONCAT71(in_stack_00000011,newTrace));
  local_80 = (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
             std::back_inserter<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                       ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_58)
  ;
  local_90 = (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
             std::
             transform<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,opentracing::v3::Value>const*,std::vector<std::pair<std::__cxx11::string,opentracing::v3::Value>,std::allocator<std::pair<std::__cxx11::string,opentracing::v3::Value>>>>,std::back_insert_iterator<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,jaegertracing::Tracer::startSpanInternal(jaegertracing::SpanContext_const&,std::__cxx11::string_const&,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const&,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>const&,std::vector<std::pair<std::__cxx11::string,opentracing::v3::Value>,std::allocator<std::pair<std::__cxx11::string,opentracing::v3::Value>>>const&,bool,std::vector<jaegertracing::Reference,std::allocator<jaegertracing::Reference>>const&)const::__0>
                       (local_70,local_78,local_80);
  local_a0._M_current =
       (Tag *)std::end<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                        ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_58
                        );
  __gnu_cxx::
  __normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
  ::__normal_iterator<jaegertracing::Tag*>
            ((__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
              *)&local_98,&local_a0);
  local_a8._M_current =
       (Tag *)std::begin<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                        ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)tags);
  local_b0 = (Tag *)std::end<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)
                               tags);
  local_b8 = (Tag *)std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
                    insert<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,void>
                              ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)
                               local_58,local_98,local_a8,
                               (__normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                                )local_b0);
  local_b9 = 0;
  this_00 = (Span *)operator_new(0x170);
  std::enable_shared_from_this<jaegertracing::Tracer>::shared_from_this(&local_d0);
  Span::Span(this_00,(shared_ptr<const_jaegertracing::Tracer> *)&local_d0,
             (SpanContext *)operationName,(string *)startTimeSystem,(time_point *)startTimeSteady,
             (time_point *)internalTags,
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_58,
             in_stack_00000020);
  std::unique_ptr<jaegertracing::Span,std::default_delete<jaegertracing::Span>>::
  unique_ptr<std::default_delete<jaegertracing::Span>,void>
            ((unique_ptr<jaegertracing::Span,std::default_delete<jaegertracing::Span>> *)this,
             this_00);
  std::shared_ptr<const_jaegertracing::Tracer>::~shared_ptr
            ((shared_ptr<const_jaegertracing::Tracer> *)&local_d0);
  peVar5 = std::
           __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&context[1]._baggage);
  pCVar6 = metrics::Metrics::spansStarted(peVar5);
  (*pCVar6->_vptr_Counter[2])(pCVar6,1);
  pSVar7 = std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::
           operator->((unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> *)
                      this);
  iVar2 = (*(pSVar7->super_Span)._vptr_Span[10])();
  bVar1 = SpanContext::isSampled((SpanContext *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    peVar5 = std::
             __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&context[1]._baggage);
    pCVar6 = metrics::Metrics::spansSampled(peVar5);
    (*pCVar6->_vptr_Counter[2])(pCVar6,1);
    if ((spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      peVar5 = std::
               __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&context[1]._baggage);
      pCVar6 = metrics::Metrics::tracesStartedSampled(peVar5);
      (*pCVar6->_vptr_Counter[2])(pCVar6,1);
    }
  }
  else {
    peVar5 = std::
             __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&context[1]._baggage);
    pCVar6 = metrics::Metrics::spansNotSampled(peVar5);
    (*pCVar6->_vptr_Counter[2])(pCVar6,1);
    if ((spanTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      peVar5 = std::
               __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&context[1]._baggage);
      pCVar6 = metrics::Metrics::tracesStartedNotSampled(peVar5);
      (*pCVar6->_vptr_Counter[2])(pCVar6,1);
    }
  }
  local_b9 = 1;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_58);
  return (__uniq_ptr_data<jaegertracing::Span,_std::default_delete<jaegertracing::Span>,_true,_true>
         )(__uniq_ptr_data<jaegertracing::Span,_std::default_delete<jaegertracing::Span>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Span>
Tracer::startSpanInternal(const SpanContext& context,
                          const std::string& operationName,
                          const SystemClock::time_point& startTimeSystem,
                          const SteadyClock::time_point& startTimeSteady,
                          const std::vector<Tag>& internalTags,
                          const std::vector<OpenTracingTag>& tags,
                          bool newTrace,
                          const std::vector<Reference>& references) const
{
    std::vector<Tag> spanTags;
    spanTags.reserve(tags.size() + internalTags.size());
    std::transform(
        std::begin(tags),
        std::end(tags),
        std::back_inserter(spanTags),
        [](const OpenTracingTag& tag) { return Tag(tag.first, tag.second); });
    spanTags.insert(
        std::end(spanTags), std::begin(internalTags), std::end(internalTags));

    std::unique_ptr<Span> span(new Span(shared_from_this(),
                                        context,
                                        operationName,
                                        startTimeSystem,
                                        startTimeSteady,
                                        spanTags,
                                        references));

    _metrics->spansStarted().inc(1);
    if (span->context().isSampled()) {
        _metrics->spansSampled().inc(1);
        if (newTrace) {
            _metrics->tracesStartedSampled().inc(1);
        }
    }
    else {
        _metrics->spansNotSampled().inc(1);
        if (newTrace) {
            _metrics->tracesStartedNotSampled().inc(1);
        }
    }

    return span;
}